

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void Utils::print_vec_unicode_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  bool bVar1;
  reference pvVar2;
  int local_20;
  int i;
  bool lastCharIsBlank;
  int to_local;
  int from_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  bVar1 = false;
  local_20 = from;
  do {
    if (to <= local_20) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    if (local_20 < 1) {
LAB_0011bda6:
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (vec,(long)local_20);
      if (*pvVar2 == 0) {
        bVar1 = true;
      }
      else {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (vec,(long)local_20);
        std::operator<<((ostream *)&std::cout,(char)*pvVar2);
      }
    }
    else {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (vec,(long)local_20);
      if ((*pvVar2 != 0) || (bVar1)) goto LAB_0011bda6;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (vec,(long)local_20);
      std::operator<<((ostream *)&std::cout,(char)*pvVar2);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void Utils::print_vec_unicode_from_to(std::vector<unsigned int>& vec, int from, int to) {
    bool lastCharIsBlank = false;
    for(int i=from; i < to; ++i){
        if(i > 0 && vec[i] == 0 && !lastCharIsBlank) {
            std::cout << (char)vec[i];
            continue;
        }
        if (vec[i] == 0) {
            lastCharIsBlank = true;
            continue;
        }
        std::cout << (char)vec[i];
    }
    std::cout << endl;
}